

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  secp256k1_fe *psVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  ulong uVar301;
  ulong uVar302;
  ulong uVar303;
  ulong uVar304;
  ulong uVar305;
  ulong uVar306;
  ulong uVar307;
  ulong uVar308;
  ulong uVar309;
  ulong uVar310;
  ulong uVar311;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_fe zz;
  
  uVar306 = s->n[0];
  uVar309 = s->n[1];
  uVar2 = s->n[2];
  uVar3 = s->n[3];
  uVar4 = s->n[4];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar306 * 2;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar3;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar309 * 2;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar4;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar4;
  uVar301 = SUB168(auVar7 * auVar147,0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar301 & 0xfffffffffffff;
  auVar5 = auVar6 * auVar146 + auVar5 * auVar145 + auVar8 * ZEXT816(0x1000003d10);
  uVar304 = auVar5._0_8_;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar304 >> 0x34 | auVar5._8_8_ << 0xc;
  uVar4 = uVar4 * 2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar306;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar309 * 2;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar2;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar301 >> 0x34 | SUB168(auVar7 * auVar147,8) << 0xc;
  auVar5 = auVar9 * auVar148 + auVar265 + auVar10 * auVar149 + auVar11 * auVar150 +
           auVar12 * ZEXT816(0x1000003d10);
  uVar305 = auVar5._0_8_;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = uVar305 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar306;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar306;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar309;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar4;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar2 * 2;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar3;
  auVar5 = auVar14 * auVar152 + auVar267 + auVar15 * auVar153;
  uVar301 = auVar5._0_8_;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uVar301 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = (uVar301 & 0xfffffffffffff) << 4 | (uVar305 & 0xfffffffffffff) >> 0x30;
  uVar307 = auVar266._0_8_;
  auVar266 = auVar13 * auVar151 + ZEXT816(0x1000003d1) * auVar154;
  uVar301 = uVar307 & 0xfffffffffffff;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uVar307 >> 0x34 | auVar266._8_8_ << 0xc;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar306 * 2;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar309;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar2;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar4;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar3;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uVar3;
  auVar6 = auVar17 * auVar156 + auVar269 + auVar18 * auVar157;
  uVar307 = auVar6._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar307 & 0xfffffffffffff;
  auVar5 = auVar16 * auVar155 + auVar268 + auVar19 * ZEXT816(0x1000003d10);
  uVar308 = auVar5._0_8_;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uVar307 >> 0x34 | auVar6._8_8_ << 0xc;
  uVar307 = uVar308 & 0xfffffffffffff;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uVar308 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar306 * 2;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar309;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar309;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar3;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar4;
  auVar271 = auVar22 * auVar160 + auVar271;
  uVar306 = auVar271._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar306 & 0xfffffffffffff;
  auVar5 = auVar20 * auVar158 + auVar270 + auVar21 * auVar159 + auVar23 * ZEXT816(0x1000003d10);
  uVar309 = auVar5._0_8_;
  uVar308 = uVar309 & 0xfffffffffffff;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = (uVar309 >> 0x34 | auVar5._8_8_ << 0xc) + (uVar304 & 0xfffffffffffff);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar306 >> 0x34 | auVar271._8_8_ << 0xc;
  auVar272 = auVar24 * ZEXT816(0x1000003d10) + auVar272;
  uVar306 = auVar272._0_8_;
  uVar304 = uVar306 & 0xfffffffffffff;
  uVar310 = (uVar306 >> 0x34 | auVar272._8_8_ << 0xc) + (uVar305 & 0xffffffffffff);
  uVar306 = (r->x).n[0];
  uVar309 = (r->x).n[1];
  uVar2 = (r->x).n[2];
  uVar3 = (r->x).n[3];
  uVar4 = (r->x).n[4];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar301;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = uVar3;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar307;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uVar2;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar308;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = uVar309;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar304;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar306;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar310;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = uVar4;
  uVar305 = SUB168(auVar29 * auVar165,0);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar305 & 0xfffffffffffff;
  auVar5 = auVar26 * auVar162 + auVar25 * auVar161 + auVar27 * auVar163 + auVar28 * auVar164 +
           auVar30 * ZEXT816(0x1000003d10);
  uVar302 = auVar5._0_8_;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar302 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar301;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uVar4;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar307;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = uVar3;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar308;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar304;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = uVar309;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar310;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uVar306;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar305 >> 0x34 | SUB168(auVar29 * auVar165,8) << 0xc;
  auVar5 = auVar31 * auVar166 + auVar273 + auVar32 * auVar167 + auVar33 * auVar168 +
           auVar34 * auVar169 + auVar35 * auVar170 + auVar36 * ZEXT816(0x1000003d10);
  uVar305 = auVar5._0_8_;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uVar305 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar301;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar306;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar307;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = uVar4;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar308;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uVar3;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar304;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uVar2;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar310;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar309;
  auVar5 = auVar38 * auVar172 + auVar274 + auVar39 * auVar173 + auVar40 * auVar174 +
           auVar41 * auVar175;
  uVar303 = auVar5._0_8_;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uVar303 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = (uVar303 & 0xfffffffffffff) << 4 | (uVar305 & 0xfffffffffffff) >> 0x30;
  auVar5 = auVar37 * auVar171 + ZEXT816(0x1000003d1) * auVar176;
  uVar303 = auVar5._0_8_;
  (r->x).n[0] = uVar303 & 0xfffffffffffff;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uVar303 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar301;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uVar309;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar307;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uVar306;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar308;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar4;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar304;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar3;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar310;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar2;
  auVar6 = auVar44 * auVar179 + auVar276 + auVar45 * auVar180 + auVar46 * auVar181;
  uVar303 = auVar6._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar303 & 0xfffffffffffff;
  auVar5 = auVar42 * auVar177 + auVar275 + auVar43 * auVar178 + auVar47 * ZEXT816(0x1000003d10);
  uVar311 = auVar5._0_8_;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar303 >> 0x34 | auVar6._8_8_ << 0xc;
  (r->x).n[1] = uVar311 & 0xfffffffffffff;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uVar311 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar301;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar2;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar307;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar309;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar308;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar306;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar304;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar4;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar310;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar3;
  auVar6 = auVar51 * auVar185 + auVar278 + auVar52 * auVar186;
  uVar306 = auVar6._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar306 & 0xfffffffffffff;
  auVar5 = auVar48 * auVar182 + auVar277 + auVar49 * auVar183 + auVar50 * auVar184 +
           auVar53 * ZEXT816(0x1000003d10);
  uVar309 = auVar5._0_8_;
  (r->x).n[2] = uVar309 & 0xfffffffffffff;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = (uVar309 >> 0x34 | auVar5._8_8_ << 0xc) + (uVar302 & 0xfffffffffffff);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar306 >> 0x34 | auVar6._8_8_ << 0xc;
  auVar279 = auVar54 * ZEXT816(0x1000003d10) + auVar279;
  uVar306 = auVar279._0_8_;
  (r->x).n[3] = uVar306 & 0xfffffffffffff;
  (r->x).n[4] = (uVar306 >> 0x34 | auVar279._8_8_ << 0xc) + (uVar305 & 0xffffffffffff);
  psVar1 = &r->y;
  uVar306 = psVar1->n[0];
  uVar309 = (r->y).n[1];
  uVar2 = (r->y).n[2];
  uVar3 = (r->y).n[3];
  uVar4 = (r->y).n[4];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar301;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar3;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar307;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar2;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar308;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar309;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar304;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar306;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar310;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar4;
  uVar305 = SUB168(auVar59 * auVar191,0);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar305 & 0xfffffffffffff;
  auVar5 = auVar56 * auVar188 + auVar55 * auVar187 + auVar57 * auVar189 + auVar58 * auVar190 +
           auVar60 * ZEXT816(0x1000003d10);
  uVar302 = auVar5._0_8_;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar302 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar301;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar4;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar307;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar3;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar308;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar2;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar304;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar309;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar310;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar306;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar305 >> 0x34 | SUB168(auVar59 * auVar191,8) << 0xc;
  auVar5 = auVar61 * auVar192 + auVar280 + auVar62 * auVar193 + auVar63 * auVar194 +
           auVar64 * auVar195 + auVar65 * auVar196 + auVar66 * ZEXT816(0x1000003d10);
  uVar305 = auVar5._0_8_;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar305 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar301;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar306;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar307;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar4;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar308;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar3;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar304;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar2;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar310;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar309;
  auVar5 = auVar68 * auVar198 + auVar281 + auVar69 * auVar199 + auVar70 * auVar200 +
           auVar71 * auVar201;
  uVar303 = auVar5._0_8_;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar303 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = (uVar303 & 0xfffffffffffff) << 4 | (uVar305 & 0xfffffffffffff) >> 0x30;
  auVar5 = auVar67 * auVar197 + ZEXT816(0x1000003d1) * auVar202;
  uVar303 = auVar5._0_8_;
  psVar1->n[0] = uVar303 & 0xfffffffffffff;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar303 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar301;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar309;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar307;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar306;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar308;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar4;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar304;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar3;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar310;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar2;
  auVar6 = auVar74 * auVar205 + auVar283 + auVar75 * auVar206 + auVar76 * auVar207;
  uVar303 = auVar6._0_8_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar303 & 0xfffffffffffff;
  auVar5 = auVar72 * auVar203 + auVar282 + auVar73 * auVar204 + auVar77 * ZEXT816(0x1000003d10);
  uVar311 = auVar5._0_8_;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar303 >> 0x34 | auVar6._8_8_ << 0xc;
  (r->y).n[1] = uVar311 & 0xfffffffffffff;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar311 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar301;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar2;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar307;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar309;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar308;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar306;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar304;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar4;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar310;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar3;
  auVar6 = auVar81 * auVar211 + auVar285 + auVar82 * auVar212;
  uVar306 = auVar6._0_8_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar306 & 0xfffffffffffff;
  auVar5 = auVar78 * auVar208 + auVar284 + auVar79 * auVar209 + auVar80 * auVar210 +
           auVar83 * ZEXT816(0x1000003d10);
  uVar309 = auVar5._0_8_;
  (r->y).n[2] = uVar309 & 0xfffffffffffff;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = (uVar309 >> 0x34 | auVar5._8_8_ << 0xc) + (uVar302 & 0xfffffffffffff);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar306 >> 0x34 | auVar6._8_8_ << 0xc;
  auVar286 = auVar84 * ZEXT816(0x1000003d10) + auVar286;
  uVar306 = auVar286._0_8_;
  (r->y).n[3] = uVar306 & 0xfffffffffffff;
  (r->y).n[4] = (uVar306 >> 0x34 | auVar286._8_8_ << 0xc) + (uVar305 & 0xffffffffffff);
  uVar306 = psVar1->n[0];
  uVar309 = (r->y).n[1];
  uVar2 = (r->y).n[2];
  uVar3 = (r->y).n[3];
  uVar4 = (r->y).n[4];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = s->n[0];
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar3;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = s->n[1];
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar2;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = s->n[2];
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar309;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = s->n[3];
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar306;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = s->n[4];
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar4;
  uVar301 = SUB168(auVar89 * auVar217,0);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar301 & 0xfffffffffffff;
  auVar5 = auVar86 * auVar214 + auVar85 * auVar213 + auVar87 * auVar215 + auVar88 * auVar216 +
           auVar90 * ZEXT816(0x1000003d10);
  uVar307 = auVar5._0_8_;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar307 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = s->n[0];
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar4;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = s->n[1];
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar3;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = s->n[2];
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar2;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = s->n[3];
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar309;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = s->n[4];
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar306;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar301 >> 0x34 | SUB168(auVar89 * auVar217,8) << 0xc;
  auVar5 = auVar91 * auVar218 + auVar287 + auVar92 * auVar219 + auVar93 * auVar220 +
           auVar94 * auVar221 + auVar95 * auVar222 + auVar96 * ZEXT816(0x1000003d10);
  uVar301 = auVar5._0_8_;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar301 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = s->n[0];
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar306;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = s->n[1];
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar4;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = s->n[2];
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar3;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = s->n[3];
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar2;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = s->n[4];
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar309;
  auVar5 = auVar98 * auVar224 + auVar288 + auVar99 * auVar225 + auVar100 * auVar226 +
           auVar101 * auVar227;
  uVar308 = auVar5._0_8_;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar308 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = (uVar308 & 0xfffffffffffff) << 4 | (uVar301 & 0xfffffffffffff) >> 0x30;
  auVar5 = auVar97 * auVar223 + ZEXT816(0x1000003d1) * auVar228;
  uVar308 = auVar5._0_8_;
  psVar1->n[0] = uVar308 & 0xfffffffffffff;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar308 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = s->n[0];
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar309;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = s->n[1];
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar306;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = s->n[2];
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uVar4;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = s->n[3];
  auVar232._8_8_ = 0;
  auVar232._0_8_ = uVar3;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = s->n[4];
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uVar2;
  auVar6 = auVar104 * auVar231 + auVar290 + auVar105 * auVar232 + auVar106 * auVar233;
  uVar308 = auVar6._0_8_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar308 & 0xfffffffffffff;
  auVar5 = auVar102 * auVar229 + auVar289 + auVar103 * auVar230 + auVar107 * ZEXT816(0x1000003d10);
  uVar304 = auVar5._0_8_;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar308 >> 0x34 | auVar6._8_8_ << 0xc;
  (r->y).n[1] = uVar304 & 0xfffffffffffff;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar304 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = s->n[0];
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar2;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = s->n[1];
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar309;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = s->n[2];
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar306;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = s->n[3];
  auVar237._8_8_ = 0;
  auVar237._0_8_ = uVar4;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = s->n[4];
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar3;
  auVar6 = auVar111 * auVar237 + auVar292 + auVar112 * auVar238;
  uVar306 = auVar6._0_8_;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar306 & 0xfffffffffffff;
  auVar5 = auVar108 * auVar234 + auVar291 + auVar109 * auVar235 + auVar110 * auVar236 +
           auVar113 * ZEXT816(0x1000003d10);
  uVar309 = auVar5._0_8_;
  (r->y).n[2] = uVar309 & 0xfffffffffffff;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = (uVar309 >> 0x34 | auVar5._8_8_ << 0xc) + (uVar307 & 0xfffffffffffff);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar306 >> 0x34 | auVar6._8_8_ << 0xc;
  auVar293 = auVar114 * ZEXT816(0x1000003d10) + auVar293;
  uVar306 = auVar293._0_8_;
  (r->y).n[3] = uVar306 & 0xfffffffffffff;
  (r->y).n[4] = (uVar306 >> 0x34 | auVar293._8_8_ << 0xc) + (uVar301 & 0xffffffffffff);
  uVar306 = (r->z).n[0];
  uVar309 = (r->z).n[1];
  uVar2 = (r->z).n[2];
  uVar3 = (r->z).n[3];
  uVar4 = (r->z).n[4];
  auVar115._8_8_ = 0;
  auVar115._0_8_ = s->n[0];
  auVar239._8_8_ = 0;
  auVar239._0_8_ = uVar3;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = s->n[1];
  auVar240._8_8_ = 0;
  auVar240._0_8_ = uVar2;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = s->n[2];
  auVar241._8_8_ = 0;
  auVar241._0_8_ = uVar309;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = s->n[3];
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar306;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = s->n[4];
  auVar243._8_8_ = 0;
  auVar243._0_8_ = uVar4;
  uVar301 = SUB168(auVar119 * auVar243,0);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar301 & 0xfffffffffffff;
  auVar5 = auVar116 * auVar240 + auVar115 * auVar239 + auVar117 * auVar241 + auVar118 * auVar242 +
           auVar120 * ZEXT816(0x1000003d10);
  uVar307 = auVar5._0_8_;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar307 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = s->n[0];
  auVar244._8_8_ = 0;
  auVar244._0_8_ = uVar4;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = s->n[1];
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar3;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = s->n[2];
  auVar246._8_8_ = 0;
  auVar246._0_8_ = uVar2;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = s->n[3];
  auVar247._8_8_ = 0;
  auVar247._0_8_ = uVar309;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = s->n[4];
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar306;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar301 >> 0x34 | SUB168(auVar119 * auVar243,8) << 0xc;
  auVar5 = auVar121 * auVar244 + auVar294 + auVar122 * auVar245 + auVar123 * auVar246 +
           auVar124 * auVar247 + auVar125 * auVar248 + auVar126 * ZEXT816(0x1000003d10);
  uVar301 = auVar5._0_8_;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar301 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = s->n[0];
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar306;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = s->n[1];
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar4;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = s->n[2];
  auVar251._8_8_ = 0;
  auVar251._0_8_ = uVar3;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = s->n[3];
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uVar2;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = s->n[4];
  auVar253._8_8_ = 0;
  auVar253._0_8_ = uVar309;
  auVar5 = auVar128 * auVar250 + auVar295 + auVar129 * auVar251 + auVar130 * auVar252 +
           auVar131 * auVar253;
  uVar308 = auVar5._0_8_;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = uVar308 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = (uVar308 & 0xfffffffffffff) << 4 | (uVar301 & 0xfffffffffffff) >> 0x30;
  auVar5 = auVar127 * auVar249 + ZEXT816(0x1000003d1) * auVar254;
  uVar308 = auVar5._0_8_;
  (r->z).n[0] = uVar308 & 0xfffffffffffff;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar308 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = s->n[0];
  auVar255._8_8_ = 0;
  auVar255._0_8_ = uVar309;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = s->n[1];
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar306;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = s->n[2];
  auVar257._8_8_ = 0;
  auVar257._0_8_ = uVar4;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = s->n[3];
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uVar3;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = s->n[4];
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar2;
  auVar6 = auVar134 * auVar257 + auVar297 + auVar135 * auVar258 + auVar136 * auVar259;
  uVar308 = auVar6._0_8_;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar308 & 0xfffffffffffff;
  auVar5 = auVar132 * auVar255 + auVar296 + auVar133 * auVar256 + auVar137 * ZEXT816(0x1000003d10);
  uVar304 = auVar5._0_8_;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = uVar308 >> 0x34 | auVar6._8_8_ << 0xc;
  (r->z).n[1] = uVar304 & 0xfffffffffffff;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = uVar304 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = s->n[0];
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uVar2;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = s->n[1];
  auVar261._8_8_ = 0;
  auVar261._0_8_ = uVar309;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = s->n[2];
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar306;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = s->n[3];
  auVar263._8_8_ = 0;
  auVar263._0_8_ = uVar4;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = s->n[4];
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uVar3;
  auVar6 = auVar141 * auVar263 + auVar299 + auVar142 * auVar264;
  uVar306 = auVar6._0_8_;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar306 & 0xfffffffffffff;
  auVar5 = auVar138 * auVar260 + auVar298 + auVar139 * auVar261 + auVar140 * auVar262 +
           auVar143 * ZEXT816(0x1000003d10);
  uVar309 = auVar5._0_8_;
  (r->z).n[2] = uVar309 & 0xfffffffffffff;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = (uVar309 >> 0x34 | auVar5._8_8_ << 0xc) + (uVar307 & 0xfffffffffffff);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar306 >> 0x34 | auVar6._8_8_ << 0xc;
  auVar300 = auVar144 * ZEXT816(0x1000003d10) + auVar300;
  uVar306 = auVar300._0_8_;
  (r->z).n[3] = uVar306 & 0xfffffffffffff;
  (r->z).n[4] = (uVar306 >> 0x34 | auVar300._8_8_ << 0xc) + (uVar301 & 0xffffffffffff);
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    VERIFY_CHECK(!secp256k1_fe_is_zero(s));
    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */
}